

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.h
# Opt level: O0

Bits __thiscall QSizePolicy::Bits::transposed(Bits *this)

{
  Bits *this_local;
  
  return (Bits)((uint)*this >> 8 & 0xff | ((uint)*this & 0xff) << 8 |
                ((uint)*this >> 0x14 & 0xf) << 0x10 | ((uint)*this >> 0x10 & 0xf) << 0x14 |
                ((uint)*this >> 0x18 & 0x1f) << 0x18 | ((uint)*this >> 0x1d & 1) << 0x1d |
                ((uint)*this >> 0x1e & 1) << 0x1e | (uint)*this & 0x80000000);
}

Assistant:

constexpr Bits transposed() const noexcept
        {
            return {verStretch, // \ swap
                    horStretch, // /
                    verPolicy, // \ swap
                    horPolicy, // /
                    ctype,
                    hfw, // \ don't swap (historic behavior)
                    wfh, // /
                    retainSizeWhenHidden};
        }